

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

void qAddPostRoutine(QtCleanUpFunction p)

{
  long lVar1;
  Type *pTVar2;
  long in_FS_OFFSET;
  QVFuncList *list;
  scoped_lock<QBasicMutex> locker;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_postRList>_>::
           operator()(in_stack_ffffffffffffffc8);
  if (pTVar2 != (Type *)0x0) {
    (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
              ((QBasicMutex *)in_stack_ffffffffffffffc8);
    QList<void_(*)()>::prepend
              ((QList<void_(*)()> *)0x33cc55,(parameter_type)in_stack_ffffffffffffffc8);
    std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x33cc61);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qAddPostRoutine(QtCleanUpFunction p)
{
    QVFuncList *list = postRList();
    if (!list)
        return;
    const auto locker = qt_scoped_lock(globalRoutinesMutex);
    list->prepend(p);
}